

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

ch_primitive * ch_table_get(ch_table *table,ch_string *key)

{
  ch_table_entry *pcVar1;
  ch_primitive *pcVar2;
  
  if (table->size != 0) {
    pcVar1 = find_entry(table->entries,table->capacity,key);
    pcVar2 = &pcVar1->value;
    if (pcVar1->key == (ch_string *)0x0) {
      pcVar2 = (ch_primitive *)0x0;
    }
    return pcVar2;
  }
  return (ch_primitive *)0x0;
}

Assistant:

ch_primitive *ch_table_get(ch_table *table, ch_string *key) {
  if (table->size == 0)
    return NULL;

  ch_table_entry *entry = find_entry(table->entries, table->capacity, key);
  if (entry->key == NULL)
    return NULL;

  return &entry->value;
}